

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall tinyusdz::crate::CrateReader::ReadBootStrap(CrateReader *this)

{
  int64_t *ret;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StreamReader *this_00;
  uint8_t *puVar2;
  bool bVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  long *plVar6;
  size_type *psVar7;
  ulong *puVar8;
  long lVar9;
  int iVar10;
  undefined8 uVar11;
  char *pcVar12;
  _Alloc_hider _Var13;
  ulong uVar14;
  uchar *in_R9;
  size_t nbytes;
  size_t sVar15;
  uint64_t uVar16;
  uint __len;
  uint8_t version [8];
  uint8_t magic [8];
  string __str_1;
  string __str;
  ostringstream ss_e;
  string local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  uint8_t local_260;
  byte local_25f;
  byte local_25e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  size_type local_238;
  string local_230;
  uint8_t *local_210;
  ulong *local_208;
  long local_200;
  ulong local_1f8 [2];
  string local_1e8;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  this_00 = this->_sr;
  uVar14 = this_00->length_;
  uVar16 = this_00->idx_;
  sVar15 = 8;
  if (uVar14 < uVar16 + 8) {
    sVar15 = uVar14 - uVar16;
  }
  if (sVar15 - 1 < 8) {
    puVar2 = this_00->binary_;
    memcpy(&local_238,puVar2 + uVar16,sVar15);
    uVar16 = uVar16 + sVar15;
    this_00->idx_ = uVar16;
    if (sVar15 != 8) goto LAB_001d265e;
    if (local_238 != 0x434453552d525850) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadBootStrap",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x183b);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      local_280.field_2._M_allocated_capacity = local_238;
      local_280._M_string_length = 8;
      local_280.field_2._8_8_ = local_280.field_2._8_8_ & 0xffffffffffffff00;
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      plVar6 = (long *)::std::__cxx11::string::replace((ulong)&local_280,0,(char *)0x0,0x5d1195);
      puVar8 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_2a0.field_2._M_allocated_capacity = *puVar8;
        local_2a0.field_2._8_8_ = plVar6[3];
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      }
      else {
        local_2a0.field_2._M_allocated_capacity = *puVar8;
        local_2a0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_2a0._M_string_length = plVar6[1];
      *plVar6 = (long)puVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)::std::__cxx11::string::append((char *)&local_2a0);
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_2c0.field_2._M_allocated_capacity = *psVar7;
        local_2c0.field_2._8_8_ = plVar6[3];
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      }
      else {
        local_2c0.field_2._M_allocated_capacity = *psVar7;
        local_2c0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_2c0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_2c0._M_dataplus._M_p,local_2c0._M_string_length
                         );
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      uVar11 = local_280.field_2._M_allocated_capacity;
      _Var13._M_p = local_280._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
LAB_001d29f1:
        operator_delete(_Var13._M_p,uVar11 + 1);
      }
      goto LAB_001d271b;
    }
    sVar15 = 8;
    if (uVar14 < uVar16 + 8) {
      sVar15 = uVar14 - uVar16;
    }
    if (7 < sVar15 - 1) {
LAB_001d2894:
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadBootStrap",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      iVar10 = 0x1842;
      goto LAB_001d26da;
    }
    memcpy(&local_260,puVar2 + uVar16,sVar15);
    this_00->idx_ = uVar16 + sVar15;
    if (sVar15 != 8) goto LAB_001d2894;
    this->_version[0] = local_260;
    this->_version[1] = local_25f;
    this->_version[2] = local_25e;
    if (3 < local_25f || local_260 != '\0') {
      if (local_260 != '\0' || 9 < local_25f) {
        local_210 = this->_version + 1;
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ReadBootStrap",0xd);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x185a);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2a0,
                   "Unsupported version {}.{}.{}. TinyUSDZ supports version up to 0.9.0","");
        fmt::format<unsigned_char,unsigned_char,unsigned_char>
                  (&local_2c0,(fmt *)&local_2a0,(string *)this,local_210,this->_version + 2,in_R9);
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_2c0._M_dataplus._M_p,
                            local_2c0._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p == &local_2c0.field_2) goto LAB_001d2760;
        goto LAB_001d2753;
      }
      ret = &this->_toc_offset;
      this->_toc_offset = 0;
      bVar3 = StreamReader::read8(this_00,ret);
      if (bVar3) {
        if ((0x58 < *ret) && (*ret < (long)this->_sr->length_)) {
          return true;
        }
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ReadBootStrap",0xd);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x1865);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        ::std::__cxx11::to_string(&local_230,*ret);
        ::std::operator+(&local_258,"Invalid TOC offset value: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_230);
        puVar5 = (undefined8 *)::std::__cxx11::string::append((char *)&local_258);
        psVar7 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_280.field_2._M_allocated_capacity = *psVar7;
          local_280.field_2._8_8_ = puVar5[3];
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        }
        else {
          local_280.field_2._M_allocated_capacity = *psVar7;
          local_280._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_280._M_string_length = puVar5[1];
        *puVar5 = psVar7;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        ::std::__cxx11::to_string(&local_1e8,this->_sr->length_);
        ::std::operator+(&local_2a0,&local_280,&local_1e8);
        plVar6 = (long *)::std::__cxx11::string::append((char *)&local_2a0);
        psVar7 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_2c0.field_2._M_allocated_capacity = *psVar7;
          local_2c0.field_2._8_8_ = plVar6[3];
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        }
        else {
          local_2c0.field_2._M_allocated_capacity = *psVar7;
          local_2c0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_2c0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_2c0._M_dataplus._M_p,
                            local_2c0._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        uVar11 = local_230.field_2._M_allocated_capacity;
        _Var13._M_p = local_230._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) goto LAB_001d29f1;
        goto LAB_001d271b;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadBootStrap",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x185f);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      pcVar12 = "Failed to read TOC offset.";
      lVar9 = 0x1a;
      goto LAB_001d26ff;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadBootStrap",0xd);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x1851);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_1e8,'\x01');
    ::std::__detail::__to_chars_10_impl<unsigned_int>(local_1e8._M_dataplus._M_p,1,0);
    puVar5 = (undefined8 *)::std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,0x5d0a60)
    ;
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_230.field_2._M_allocated_capacity = *psVar7;
      local_230.field_2._8_8_ = puVar5[3];
    }
    else {
      local_230.field_2._M_allocated_capacity = *psVar7;
      local_230._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_230._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar6 = (long *)::std::__cxx11::string::append((char *)&local_230);
    puVar8 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_258.field_2._M_allocated_capacity = *puVar8;
      local_258.field_2._8_8_ = plVar6[3];
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    }
    else {
      local_258.field_2._M_allocated_capacity = *puVar8;
      local_258._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_258._M_string_length = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_208 = local_1f8;
    ::std::__cxx11::string::_M_construct((ulong)&local_208,'\x01');
    ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_208,1,(uint)local_25f);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      uVar11 = local_258.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_200 + local_258._M_string_length) {
      uVar14 = 0xf;
      if (local_208 != local_1f8) {
        uVar14 = local_1f8[0];
      }
      if (uVar14 < local_200 + local_258._M_string_length) goto LAB_001d2dd7;
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace
                         ((ulong)&local_208,0,(char *)0x0,(ulong)local_258._M_dataplus._M_p);
    }
    else {
LAB_001d2dd7:
      puVar5 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_208);
    }
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_280.field_2._M_allocated_capacity = *psVar7;
      local_280.field_2._8_8_ = puVar5[3];
    }
    else {
      local_280.field_2._M_allocated_capacity = *psVar7;
      local_280._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_280._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)psVar7 = 0;
    plVar6 = (long *)::std::__cxx11::string::append((char *)&local_280);
    paVar1 = &local_2a0.field_2;
    puVar8 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_2a0.field_2._M_allocated_capacity = *puVar8;
      local_2a0.field_2._8_8_ = plVar6[3];
      local_2a0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_2a0.field_2._M_allocated_capacity = *puVar8;
      local_2a0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_2a0._M_string_length = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    __len = 1;
    if (9 < local_25e) {
      __len = 3 - (local_25e < 100);
    }
    local_1c8 = local_1b8;
    ::std::__cxx11::string::_M_construct((ulong)&local_1c8,(char)__len);
    ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1c8,__len,(uint)local_25e);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar1) {
      uVar11 = local_2a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_1c0 + local_2a0._M_string_length) {
      uVar14 = 0xf;
      if (local_1c8 != local_1b8) {
        uVar14 = local_1b8[0];
      }
      if (uVar14 < local_1c0 + local_2a0._M_string_length) goto LAB_001d2fcd;
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace
                         ((ulong)&local_1c8,0,(char *)0x0,(ulong)local_2a0._M_dataplus._M_p);
    }
    else {
LAB_001d2fcd:
      puVar5 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_1c8);
    }
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_2c0.field_2._M_allocated_capacity = *psVar7;
      local_2c0.field_2._8_8_ = puVar5[3];
    }
    else {
      local_2c0.field_2._M_allocated_capacity = *psVar7;
      local_2c0._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_2c0._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)psVar7 = 0;
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_208 != local_1f8) {
      operator_delete(local_208,local_1f8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2c0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p == &local_2c0.field_2) goto LAB_001d2760;
  }
  else {
LAB_001d265e:
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadBootStrap",0xd);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    iVar10 = 0x1835;
LAB_001d26da:
    poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,iVar10);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    pcVar12 = "Failed to read magic number.";
    lVar9 = 0x1c;
LAB_001d26ff:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar12,lVar9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
LAB_001d271b:
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2c0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p == &local_2c0.field_2) goto LAB_001d2760;
  }
LAB_001d2753:
  operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
LAB_001d2760:
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool CrateReader::ReadBootStrap() {
  // parse header.
  uint8_t magic[8];
  if (8 != _sr->read(/* req */ 8, /* dst len */ 8, magic)) {
    PUSH_ERROR("Failed to read magic number.");
    return false;
  }

  if (memcmp(magic, "PXR-USDC", 8)) {
    PUSH_ERROR("Invalid magic number. Expected 'PXR-USDC' but got '" +
               std::string(magic, magic + 8) + "'");
    return false;
  }

  // parse version(first 3 bytes from 8 bytes)
  uint8_t version[8];
  if (8 != _sr->read(8, 8, version)) {
    PUSH_ERROR("Failed to read magic number.");
    return false;
  }

  DCOUT("version = " << int(version[0]) << "." << int(version[1]) << "."
                     << int(version[2]));

  _version[0] = version[0];
  _version[1] = version[1];
  _version[2] = version[2];

  // We only support version 0.4.0 or later.
  if ((version[0] == 0) && (version[1] < 4)) {
    PUSH_ERROR("Version must be 0.4.0 or later, but got " +
               std::to_string(version[0]) + "." + std::to_string(version[1]) +
               "." + std::to_string(version[2]));
    return false;
  }

  // Currently up to 0.9.0
  if ((version[0] == 0) && (version[1] < 10)) {
    // ok
  } else {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Unsupported version {}.{}.{}. TinyUSDZ supports version up to 0.9.0",
      _version[0], _version[1], _version[2]));
  }

  _toc_offset = 0;
  if (!_sr->read8(&_toc_offset)) {
    PUSH_ERROR("Failed to read TOC offset.");
    return false;
  }

  if ((_toc_offset <= 88) || (_toc_offset >= int64_t(_sr->size()))) {
    PUSH_ERROR("Invalid TOC offset value: " + std::to_string(_toc_offset) +
               ", filesize = " + std::to_string(_sr->size()) + ".");
    return false;
  }

  DCOUT("toc offset = " << _toc_offset);

  return true;
}